

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O0

bool __thiscall
ear::GainCalculatorDirectSpeakersImpl::_isLfeChannel
          (GainCalculatorDirectSpeakersImpl *this,DirectSpeakersTypeMetadata *metadata,
          WarningCB *warning_cb)

{
  function<void_(const_ear::Warning_&)> *pfVar1;
  WarningCB *this_00;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  reference_const_type pdVar5;
  reference pbVar6;
  size_type sVar7;
  __type local_181;
  bool local_14a;
  allocator<char> local_149;
  Warning local_148;
  byte local_11b;
  byte local_11a;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string nominalLabel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> speakerLabel;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool has_lfe_name;
  allocator<char> local_61;
  Warning local_60;
  bool local_31;
  WarningCB *pWStack_30;
  bool has_lfe_freq;
  WarningCB *warning_cb_local;
  DirectSpeakersTypeMetadata *metadata_local;
  GainCalculatorDirectSpeakersImpl *this_local;
  optional<double> *local_10;
  
  pWStack_30 = warning_cb;
  warning_cb_local = (WarningCB *)metadata;
  metadata_local = (DirectSpeakersTypeMetadata *)this;
  bVar2 = boost::operator!=(&metadata->channelFrequency);
  local_14a = false;
  if (bVar2) {
    pdVar5 = boost::optional<double>::get
                       ((optional<double> *)
                        ((long)&warning_cb_local[7].super__Function_base._M_functor + 8));
    local_14a = false;
    if (*pdVar5 <= 200.0) {
      local_14a = boost::operator==(&warning_cb_local[7]._M_invoker);
    }
  }
  local_31 = local_14a;
  if (local_14a == false) {
    local_10 = (optional<double> *)((long)&warning_cb_local[7].super__Function_base._M_functor + 8);
    bVar2 = boost::optional<double>::operator!(local_10);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      this_local = (GainCalculatorDirectSpeakersImpl *)&warning_cb_local[7]._M_invoker;
      bVar2 = boost::optional<double>::operator!((optional<double> *)this_local);
      if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_0022e64e;
    }
    pfVar1 = pWStack_30;
    local_60.code = FREQ_NOT_LFE;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60.message,
               "frequency indication present but does not indicate an LFE channel",&local_61);
    std::function<void_(const_ear::Warning_&)>::operator()(pfVar1,&local_60);
    Warning::~Warning(&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
LAB_0022e64e:
  this_00 = warning_cb_local;
  bVar2 = false;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)warning_cb_local);
  speakerLabel.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&speakerLabel.field_2 + 8)), bVar3) {
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)(nominalLabel.field_2._M_local_buf + 8),(string *)pbVar6)
    ;
    _nominalSpeakerLabel((string *)local_d0,this,(string *)(nominalLabel.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    local_11a = 0;
    local_11b = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"LFE1",&local_f1);
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d0,&local_f0);
    local_181 = true;
    if (!_Var4) {
      std::allocator<char>::allocator();
      local_11a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"LFE2",&local_119);
      local_11b = 1;
      local_181 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0,&local_118);
    }
    if ((local_11b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_118);
    }
    if ((local_11a & 1) != 0) {
      std::allocator<char>::~allocator(&local_119);
    }
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    if (local_181 != false) {
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)(nominalLabel.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  if (((bool)(local_31 & 1U) != bVar2) &&
     (sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)warning_cb_local), pfVar1 = pWStack_30, sVar7 != 0)) {
    local_148.code = FREQ_SPEAKERLABEL_LFE_MISMATCH;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148.message,
               "LFE indication from frequency element does not match speakerLabel",&local_149);
    std::function<void_(const_ear::Warning_&)>::operator()(pfVar1,&local_148);
    Warning::~Warning(&local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  bVar3 = true;
  if ((local_31 & 1U) == 0) {
    bVar3 = bVar2;
  }
  return bVar3;
}

Assistant:

bool GainCalculatorDirectSpeakersImpl::_isLfeChannel(
      const DirectSpeakersTypeMetadata& metadata, const WarningCB& warning_cb) {
    bool has_lfe_freq = (metadata.channelFrequency.lowPass != boost::none &&
                         metadata.channelFrequency.lowPass.get() <= 200 &&
                         metadata.channelFrequency.highPass == boost::none);
    if (!has_lfe_freq && (metadata.channelFrequency.lowPass ||
                          metadata.channelFrequency.highPass))
      warning_cb({Warning::Code::FREQ_NOT_LFE,
                  "frequency indication present but does "
                  "not indicate an LFE channel"});

    bool has_lfe_name = false;
    for (auto speakerLabel : metadata.speakerLabels) {
      std::string nominalLabel = _nominalSpeakerLabel(speakerLabel);
      if (nominalLabel == std::string("LFE1") ||
          nominalLabel == std::string("LFE2")) {
        has_lfe_name = true;
      }
    }

    if (has_lfe_freq != has_lfe_name && metadata.speakerLabels.size())
      warning_cb({Warning::Code::FREQ_SPEAKERLABEL_LFE_MISMATCH,
                  "LFE indication from frequency element does not match "
                  "speakerLabel"});

    return has_lfe_freq || has_lfe_name;
  }